

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupsExceptModals(void)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint remaining;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar5 = (ulong)uVar1;
  lVar3 = uVar5 * 0x30 + -0x28;
  do {
    uVar4 = (uint)uVar5;
    remaining = (int)uVar1 >> 0x1f & uVar1;
    if (((int)uVar4 < 1) ||
       (lVar2 = *(long *)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar3),
       remaining = uVar4, lVar2 == 0)) break;
    lVar3 = lVar3 + -0x30;
    uVar5 = uVar5 - 1;
  } while ((*(byte *)(lVar2 + 0xf) & 8) == 0);
  if ((int)uVar1 <= (int)remaining) {
    return;
  }
  ClosePopupToLevel(remaining,true);
  return;
}

Assistant:

void ImGui::ClosePopupsExceptModals()
{
    ImGuiContext& g = *GImGui;

    int popup_count_to_keep;
    for (popup_count_to_keep = g.OpenPopupStack.Size; popup_count_to_keep > 0; popup_count_to_keep--)
    {
        ImGuiWindow* window = g.OpenPopupStack[popup_count_to_keep - 1].Window;
        if (!window || window->Flags & ImGuiWindowFlags_Modal)
            break;
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
        ClosePopupToLevel(popup_count_to_keep, true);
}